

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler.cpp
# Opt level: O0

void __thiscall
cubeb_resampler_speex<float,_delay_line<float>,_cubeb_resampler_speex_one_way<float>_>::
cubeb_resampler_speex
          (cubeb_resampler_speex<float,_delay_line<float>,_cubeb_resampler_speex_one_way<float>_>
           *this,delay_line<float> *input_processor,
          cubeb_resampler_speex_one_way<float> *output_processor,cubeb_stream *s,
          cubeb_data_callback cb,void *ptr)

{
  size_t in_RCX;
  long in_RDX;
  long in_RSI;
  pointer in_RDI;
  size_t in_R8;
  unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
  *in_R9;
  
  cubeb_resampler::cubeb_resampler((cubeb_resampler *)in_RDI);
  *(undefined ***)&in_RDI->_vptr_cubeb_resampler_speex_one_way = &PTR_fill_00180060;
  std::unique_ptr<delay_line<float>,std::default_delete<delay_line<float>>>::
  unique_ptr<std::default_delete<delay_line<float>>,void>
            ((unique_ptr<delay_line<float>,_std::default_delete<delay_line<float>_>_> *)in_R9,
             (pointer)in_RDI);
  std::
  unique_ptr<cubeb_resampler_speex_one_way<float>,std::default_delete<cubeb_resampler_speex_one_way<float>>>
  ::unique_ptr<std::default_delete<cubeb_resampler_speex_one_way<float>>,void>(in_R9,in_RDI);
  (in_RDI->resampling_in_buffer).capacity_ = in_RCX;
  (in_RDI->resampling_in_buffer).length_ = in_R8;
  (in_RDI->resampling_out_buffer).data_ = (float *)in_R9;
  *(undefined1 *)&(in_RDI->resampling_out_buffer).capacity_ = 0;
  if ((in_RSI == 0) || (in_RDX == 0)) {
    if (in_RSI == 0) {
      if (in_RDX != 0) {
        *(code **)&in_RDI->resampling_ratio = fill_internal_output;
        (in_RDI->resampling_in_buffer).data_ = (float *)0x0;
      }
    }
    else {
      *(code **)&in_RDI->resampling_ratio = fill_internal_input;
      (in_RDI->resampling_in_buffer).data_ = (float *)0x0;
    }
  }
  else {
    *(code **)&in_RDI->resampling_ratio = fill_internal_duplex;
    (in_RDI->resampling_in_buffer).data_ = (float *)0x0;
  }
  return;
}

Assistant:

cubeb_resampler_speex<T, InputProcessor, OutputProcessor>::
    cubeb_resampler_speex(InputProcessor * input_processor,
                          OutputProcessor * output_processor, cubeb_stream * s,
                          cubeb_data_callback cb, void * ptr)
    : input_processor(input_processor), output_processor(output_processor),
      stream(s), data_callback(cb), user_ptr(ptr)
{
  if (input_processor && output_processor) {
    fill_internal = &cubeb_resampler_speex::fill_internal_duplex;
  } else if (input_processor) {
    fill_internal = &cubeb_resampler_speex::fill_internal_input;
  } else if (output_processor) {
    fill_internal = &cubeb_resampler_speex::fill_internal_output;
  }
}